

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResourceMappingBase.cpp
# Opt level: O0

void __thiscall
Diligent::ResourceMappingImpl::AddResourceArray
          (ResourceMappingImpl *this,Char *Name,Uint32 StartIndex,IDeviceObject **ppObjects,
          Uint32 NumElements,bool bIsUnique)

{
  undefined *puVar1;
  pointer ppVar2;
  IDeviceObject *pIVar3;
  Char *Message;
  undefined8 uVar4;
  undefined4 in_register_00000084;
  char (*Args_2) [80];
  pair<std::__detail::_Node_iterator<std::pair<const_Diligent::ResourceMappingImpl::ResMappingHashKey,_Diligent::RefCntAutoPtr<Diligent::IDeviceObject>_>,_false,_false>,_bool>
  pVar5;
  undefined1 local_d0 [8];
  string _msg;
  string msg;
  ResMappingHashKey local_70;
  _Node_iterator_base<std::pair<const_Diligent::ResourceMappingImpl::ResMappingHashKey,_Diligent::RefCntAutoPtr<Diligent::IDeviceObject>_>,_false>
  local_58;
  pair<std::__detail::_Node_iterator<std::pair<const_Diligent::ResourceMappingImpl::ResMappingHashKey,_Diligent::RefCntAutoPtr<Diligent::IDeviceObject>_>,_false,_false>,_bool>
  Elems;
  IDeviceObject *pObject;
  Uint32 Elem;
  SpinLockGuard Guard;
  bool bIsUnique_local;
  Uint32 NumElements_local;
  IDeviceObject **ppObjects_local;
  Char *pCStack_18;
  Uint32 StartIndex_local;
  Char *Name_local;
  ResourceMappingImpl *this_local;
  
  Args_2 = (char (*) [80])CONCAT44(in_register_00000084,NumElements);
  if ((Name != (Char *)0x0) && (*Name != '\0')) {
    Guard._M_device._3_1_ = bIsUnique;
    Guard._M_device._4_4_ = NumElements;
    pCStack_18 = Name;
    Name_local = (Char *)this;
    std::lock_guard<Threading::SpinLock>::lock_guard
              ((lock_guard<Threading::SpinLock> *)&stack0xffffffffffffffc8,&this->m_Lock);
    for (pObject._4_4_ = 0; pObject._4_4_ < Guard._M_device._4_4_; pObject._4_4_ = pObject._4_4_ + 1
        ) {
      Elems._8_8_ = ppObjects[pObject._4_4_];
      ResMappingHashKey::ResMappingHashKey(&local_70,pCStack_18,true,StartIndex + pObject._4_4_);
      pVar5 = std::
              unordered_map<Diligent::ResourceMappingImpl::ResMappingHashKey,Diligent::RefCntAutoPtr<Diligent::IDeviceObject>,Diligent::HashMapStringKey::Hasher,std::equal_to<Diligent::ResourceMappingImpl::ResMappingHashKey>,Diligent::STDAllocator<std::pair<Diligent::ResourceMappingImpl::ResMappingHashKey_const,Diligent::RefCntAutoPtr<Diligent::IDeviceObject>>,Diligent::IMemoryAllocator>>
              ::emplace<Diligent::ResourceMappingImpl::ResMappingHashKey,Diligent::IDeviceObject*&>
                        ((unordered_map<Diligent::ResourceMappingImpl::ResMappingHashKey,Diligent::RefCntAutoPtr<Diligent::IDeviceObject>,Diligent::HashMapStringKey::Hasher,std::equal_to<Diligent::ResourceMappingImpl::ResMappingHashKey>,Diligent::STDAllocator<std::pair<Diligent::ResourceMappingImpl::ResMappingHashKey_const,Diligent::RefCntAutoPtr<Diligent::IDeviceObject>>,Diligent::IMemoryAllocator>>
                          *)&this->m_HashTable,&local_70,(IDeviceObject **)&Elems.second);
      local_58._M_cur =
           (__node_type *)
           pVar5.first.
           super__Node_iterator_base<std::pair<const_Diligent::ResourceMappingImpl::ResMappingHashKey,_Diligent::RefCntAutoPtr<Diligent::IDeviceObject>_>,_false>
           ._M_cur;
      Elems.first.
      super__Node_iterator_base<std::pair<const_Diligent::ResourceMappingImpl::ResMappingHashKey,_Diligent::RefCntAutoPtr<Diligent::IDeviceObject>_>,_false>
      ._M_cur._0_1_ = pVar5.second;
      ResMappingHashKey::~ResMappingHashKey(&local_70);
      if (((byte)Elems.first.
                 super__Node_iterator_base<std::pair<const_Diligent::ResourceMappingImpl::ResMappingHashKey,_Diligent::RefCntAutoPtr<Diligent::IDeviceObject>_>,_false>
                 ._M_cur & 1) == 0) {
        ppVar2 = std::__detail::
                 _Node_iterator<std::pair<const_Diligent::ResourceMappingImpl::ResMappingHashKey,_Diligent::RefCntAutoPtr<Diligent::IDeviceObject>_>,_false,_false>
                 ::operator->((_Node_iterator<std::pair<const_Diligent::ResourceMappingImpl::ResMappingHashKey,_Diligent::RefCntAutoPtr<Diligent::IDeviceObject>_>,_false,_false>
                               *)&local_58);
        pIVar3 = Diligent::RefCntAutoPtr::operator_cast_to_IDeviceObject_
                           ((RefCntAutoPtr *)&ppVar2->second);
        if (pIVar3 != (IDeviceObject *)Elems._8_8_) {
          if ((Guard._M_device._3_1_ & 1) != 0) {
            FormatString<char[43]>
                      ((string *)((long)&_msg.field_2 + 8),
                       (char (*) [43])"Resource with the same name already exists");
            Message = (Char *)std::__cxx11::string::c_str();
            DebugAssertionFailed
                      (Message,"AddResourceArray",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/ResourceMappingBase.cpp"
                       ,0x37);
            std::__cxx11::string::~string((string *)(_msg.field_2._M_local_buf + 8));
            FormatString<char[20],char_const*,char[80]>
                      ((string *)local_d0,(Diligent *)"Resource with name ",
                       (char (*) [20])&stack0xffffffffffffffe8,
                       (char **)
                       " marked is unique, but already present in the hash.\nNew resource will be used\n."
                       ,Args_2);
            puVar1 = DebugMessageCallback;
            if (DebugMessageCallback != (undefined *)0x0) {
              uVar4 = std::__cxx11::string::c_str();
              Args_2 = (char (*) [80])0x0;
              (*(code *)puVar1)(1,uVar4,0);
            }
            std::__cxx11::string::~string((string *)local_d0);
          }
          uVar4 = Elems._8_8_;
          ppVar2 = std::__detail::
                   _Node_iterator<std::pair<const_Diligent::ResourceMappingImpl::ResMappingHashKey,_Diligent::RefCntAutoPtr<Diligent::IDeviceObject>_>,_false,_false>
                   ::operator->((_Node_iterator<std::pair<const_Diligent::ResourceMappingImpl::ResMappingHashKey,_Diligent::RefCntAutoPtr<Diligent::IDeviceObject>_>,_false,_false>
                                 *)&local_58);
          RefCntAutoPtr<Diligent::IDeviceObject>::operator=(&ppVar2->second,(IDeviceObject *)uVar4);
        }
      }
    }
    std::lock_guard<Threading::SpinLock>::~lock_guard
              ((lock_guard<Threading::SpinLock> *)&stack0xffffffffffffffc8);
  }
  return;
}

Assistant:

void ResourceMappingImpl::AddResourceArray(const Char* Name, Uint32 StartIndex, IDeviceObject* const* ppObjects, Uint32 NumElements, bool bIsUnique)
{
    if (Name == nullptr || *Name == 0)
        return;

    Threading::SpinLockGuard Guard{m_Lock};
    for (Uint32 Elem = 0; Elem < NumElements; ++Elem)
    {
        auto* pObject = ppObjects[Elem];

        // Try to construct new element in place
        auto Elems = m_HashTable.emplace(ResMappingHashKey{Name, true /*Make copy*/, StartIndex + Elem}, pObject);
        // If there is already element with the same name, replace it
        if (!Elems.second && Elems.first->second != pObject)
        {
            if (bIsUnique)
            {
                UNEXPECTED("Resource with the same name already exists");
                LOG_WARNING_MESSAGE(
                    "Resource with name ", Name,
                    " marked is unique, but already present in the hash.\n"
                    "New resource will be used\n.");
            }
            Elems.first->second = pObject;
        }
    }
}